

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O2

void retro_init(void)

{
  gbstatus_e gVar1;
  
  gVar1 = gb_emu_init(&gb_emu);
  if (gVar1 == GBSTATUS_OK) {
    gb_framebuffer = gb_emu_framebuffer_ptr(&gb_emu);
    gb_frame_ready_ptr = gb_emu_frame_ready_ptr(&gb_emu);
    out_framebuffer = (char *)calloc(0x16800,1);
    if (out_framebuffer != (char *)0x0) {
      core_initialized = 1;
      return;
    }
    builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
    builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
    gb_emu_deinit(&gb_emu);
    gVar1 = GBSTATUS_BAD_ALLOC;
  }
  osd_msg("%s ([%s] %s)\n","Failed to initialize Gameboy core!",gbstatus_str_repr[gVar1],
          gbstatus_str);
  return;
}

Assistant:

void retro_init()
{
   gbstatus_e status = GBSTATUS_OK;

   status = gb_emu_init(&gb_emu);
   if (status != GBSTATUS_OK)
      goto error_handler0;

   gb_framebuffer     = gb_emu_framebuffer_ptr(&gb_emu);
   gb_frame_ready_ptr = gb_emu_frame_ready_ptr(&gb_emu);

   // XRGB8888
   out_framebuffer = calloc(GB_SCREEN_HEIGHT * GB_SCREEN_WIDTH * 4, sizeof(char));
   if (out_framebuffer == NULL)
   {
      GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
      goto error_handler1;
   }

   core_initialized = true;
   return;

error_handler1:
   gb_emu_deinit(&gb_emu);

error_handler0:
   GBSTATUS_ERR_PRINT("Failed to initialize Gameboy core!");
}